

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_Connection_completeMessages
          (UA_Connection *connection,UA_ByteString *message,UA_Boolean *realloced)

{
  UA_ByteString *pUVar1;
  size_t sVar2;
  bool bVar3;
  uint3 uVar4;
  bool bVar5;
  UA_StatusCode UVar6;
  UA_Byte *pUVar7;
  void *pvVar8;
  bool bVar9;
  ulong uVar10;
  size_t sVar11;
  size_t local_60;
  size_t length_pos;
  UA_Boolean *local_50;
  uint local_44;
  UA_ByteString *pUStack_40;
  UA_UInt32 chunk_length;
  UA_StatusCode local_34;
  
  pUVar1 = &connection->incompleteMessage;
  sVar2 = (connection->incompleteMessage).length;
  local_50 = realloced;
  pUStack_40 = pUVar1;
  if (sVar2 != 0) {
    sVar11 = sVar2 + message->length;
    pUVar7 = (UA_Byte *)realloc((connection->incompleteMessage).data,sVar11);
    if (pUVar7 != (UA_Byte *)0x0) {
      memcpy(pUVar7 + (connection->incompleteMessage).length,message->data,message->length);
      (*connection->releaseRecvBuffer)(connection,message);
      message->data = pUVar7;
      message->length = sVar11;
      *local_50 = true;
      pUVar1->length = 0;
      (connection->incompleteMessage).data = (UA_Byte *)0x0;
      goto LAB_00113b1c;
    }
    local_34 = 0x80030000;
    goto LAB_00113d14;
  }
LAB_00113b1c:
  local_34 = 0;
  bVar9 = false;
  sVar11 = 0;
  length_pos = (size_t)connection;
  do {
    uVar10 = sVar11;
    if (message->length - sVar11 < 8) break;
    uVar4 = CONCAT12(message->data[sVar11 + 2],*(undefined2 *)(message->data + sVar11));
    bVar3 = false;
    bVar5 = true;
    if (uVar4 < 0x4e504f) {
      if (((uVar4 == 0x47534d) || (uVar4 == 0x4b4341)) || (uVar4 == 0x4c4548)) {
LAB_00113b90:
        local_44 = 0;
        local_60 = sVar11 + 4;
        UVar6 = UA_decodeBinary(message,&local_60,&local_44,UA_TYPES + 6);
        if ((local_44 < 0x10 || UVar6 != 0) || (*(uint *)(length_pos + 0xc) < local_44)) {
          bVar3 = false;
          bVar5 = true;
        }
        else {
          uVar10 = local_44 + sVar11;
          bVar3 = uVar10 <= message->length;
          bVar5 = bVar9;
          if (message->length < uVar10) {
            uVar10 = sVar11;
          }
        }
      }
    }
    else if (((uVar4 == 0x4e504f) || (uVar4 == 0x525245)) || (uVar4 == 0x4f4c43)) goto LAB_00113b90;
    bVar9 = bVar5;
    sVar11 = uVar10;
  } while (bVar3);
  connection = (UA_Connection *)length_pos;
  sVar11 = message->length;
  if (sVar11 == uVar10) {
LAB_00113cd5:
    local_34 = 0;
  }
  else {
    if (bVar9) {
      if (uVar10 != 0) {
LAB_00113cd2:
        message->length = uVar10;
        goto LAB_00113cd5;
      }
    }
    else {
      if (uVar10 == 0) {
        if (*local_50 == false) {
          pUStack_40->length = 0;
          pUStack_40->data = (UA_Byte *)0x0;
          bVar9 = true;
          if (sVar11 == 0) {
            local_34 = 0;
          }
          else {
            pvVar8 = malloc(sVar11);
            *(void **)((long)connection + 0x50) = pvVar8;
            if (pvVar8 == (void *)0x0) {
              local_34 = 0x80030000;
              bVar9 = false;
            }
            else {
              local_34 = 0;
              pUStack_40->length = sVar11;
            }
          }
          if (!bVar9) goto LAB_00113d14;
          memcpy(*(void **)((long)connection + 0x50),message->data,message->length);
          (**(code **)((long)connection + 0x78))(connection,message);
          *local_50 = true;
        }
        else {
          pUVar7 = message->data;
          pUStack_40->length = message->length;
          pUStack_40->data = pUVar7;
          message->length = 0;
          message->data = (UA_Byte *)0x0;
        }
        goto LAB_00113cd5;
      }
      local_34 = 0;
      pUStack_40->length = 0;
      pUStack_40->data = (UA_Byte *)0x0;
      bVar9 = true;
      sVar11 = sVar11 - uVar10;
      if (sVar11 != 0) {
        pvVar8 = malloc(sVar11);
        *(void **)((long)connection + 0x50) = pvVar8;
        local_34 = 0;
        if (pvVar8 == (void *)0x0) {
          local_34 = 0x80030000;
          bVar9 = false;
        }
        else {
          pUStack_40->length = sVar11;
        }
      }
      if (bVar9) {
        memcpy(*(void **)((long)connection + 0x50),message->data + uVar10,sVar11);
        goto LAB_00113cd2;
      }
    }
LAB_00113d14:
    if (*local_50 == false) {
      (*connection->releaseRecvBuffer)(connection,message);
    }
    pUVar1 = pUStack_40;
    deleteMembers_noInit(pUStack_40,UA_TYPES + 0xe);
    pUVar1->length = 0;
    pUVar1->data = (UA_Byte *)0x0;
  }
  return local_34;
}

Assistant:

UA_StatusCode
UA_Connection_completeMessages(UA_Connection *connection, UA_ByteString *message,
                               UA_Boolean *realloced) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;

    /* We have a stored an incomplete chunk. Concat the received message to the end.
     * After this block, connection->incompleteMessage is always empty. */
    if(connection->incompleteMessage.length > 0) {
        size_t length = connection->incompleteMessage.length + message->length;
        UA_Byte *data = (UA_Byte*)UA_realloc(connection->incompleteMessage.data, length);
        if(!data) {
            retval = UA_STATUSCODE_BADOUTOFMEMORY;
            goto cleanup;
        }
        memcpy(&data[connection->incompleteMessage.length], message->data, message->length);
        connection->releaseRecvBuffer(connection, message);
        message->data = data;
        message->length = length;
        *realloced = true;
        connection->incompleteMessage = UA_BYTESTRING_NULL;
    }

    /* Loop over the chunks in the received buffer */
    size_t complete_until = 0; /* the received complete chunks end at this point */
    UA_Boolean garbage_end = false; /* garbage after the last complete message */
    while(message->length - complete_until >= 8) {
        /* Check the message type */
        UA_UInt32 msgtype = (UA_UInt32)message->data[complete_until] +
            ((UA_UInt32)message->data[complete_until+1] << 8) +
            ((UA_UInt32)message->data[complete_until+2] << 16);
        if(msgtype != ('M' + ('S' << 8) + ('G' << 16)) &&
           msgtype != ('E' + ('R' << 8) + ('R' << 16)) &&
           msgtype != ('O' + ('P' << 8) + ('N' << 16)) &&
           msgtype != ('H' + ('E' << 8) + ('L' << 16)) &&
           msgtype != ('A' + ('C' << 8) + ('K' << 16)) &&
           msgtype != ('C' + ('L' << 8) + ('O' << 16))) {
            garbage_end = true; /* the message type is not recognized */
            break;
        }

        /* Decode the length of the chunk */
        UA_UInt32 chunk_length = 0;
        size_t length_pos = complete_until + 4;
        UA_StatusCode decode_retval = UA_UInt32_decodeBinary(message, &length_pos, &chunk_length);

        /* The message size is not allowed. Throw the remaining bytestring away */
        if(decode_retval != UA_STATUSCODE_GOOD ||
           chunk_length < 16 ||
           chunk_length > connection->localConf.recvBufferSize) {
            garbage_end = true;
            break;
        }

        /* The chunk is okay but incomplete. Store the end. */
        if(chunk_length + complete_until > message->length)
            break;

        complete_until += chunk_length; /* Go to the next chunk */
    }

    /* Separate incomplete chunks */
    if(complete_until != message->length) {
        /* Garbage after the last good chunk. No need to keep a buffer */
        if(garbage_end) {
            if(complete_until == 0)
                goto cleanup; /* All garbage, only happens on messages from the network layer */
            message->length = complete_until;
            return UA_STATUSCODE_GOOD;
        }

        /* No good chunk, only an incomplete one */
        if(complete_until == 0) {
            if(!*realloced) {
                retval = UA_ByteString_allocBuffer(&connection->incompleteMessage, message->length);
                if(retval != UA_STATUSCODE_GOOD)
                    goto cleanup;
                memcpy(connection->incompleteMessage.data, message->data, message->length);
                connection->releaseRecvBuffer(connection, message);
                *realloced = true;
            } else {
                connection->incompleteMessage = *message;
                *message = UA_BYTESTRING_NULL;
            }
            return UA_STATUSCODE_GOOD;
        }

        /* At least one good chunk and an incomplete one */
        size_t incomplete_length = message->length - complete_until;
        retval = UA_ByteString_allocBuffer(&connection->incompleteMessage, incomplete_length);
        if(retval != UA_STATUSCODE_GOOD)
            goto cleanup;
        memcpy(connection->incompleteMessage.data,
               &message->data[complete_until], incomplete_length);
        message->length = complete_until;
    }

    return UA_STATUSCODE_GOOD;

 cleanup:
    if(!*realloced)
        connection->releaseRecvBuffer(connection, message);
    UA_ByteString_deleteMembers(&connection->incompleteMessage);
    return retval;
}